

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void sorter_sqrt_sort_merge_right(int64_t *arr,int L1,int L2,int M)

{
  int p1;
  int p2;
  int p0;
  int M_local;
  int L2_local;
  int L1_local;
  int64_t *arr_local;
  
  p0 = L1 + L2 + M;
  p1 = L1 + -1;
  p2 = L1 + L2 + -1;
  while (p0 = p0 + -1, -1 < p1) {
    if ((p2 < L1) || (0 < arr[p1] - arr[p2])) {
      arr[p0] = arr[p1];
      p1 = p1 + -1;
    }
    else {
      arr[p0] = arr[p2];
      p2 = p2 + -1;
    }
  }
  if (p2 != p0) {
    while (L1 <= p2) {
      arr[p0] = arr[p2];
      p2 = p2 + -1;
      p0 = p0 + -1;
    }
  }
  return;
}

Assistant:

static void SQRT_SORT_MERGE_RIGHT(SORT_TYPE *arr, int L1, int L2, int M) {
  int p0 = L1 + L2 + M - 1, p2 = L1 + L2 - 1, p1 = L1 - 1;

  while (p1 >= 0) {
    if (p2 < L1 || SORT_CMP_A(arr + p1, arr + p2) > 0) {
      arr[p0--] = arr[p1--];
    } else {
      arr[p0--] = arr[p2--];
    }
  }

  if (p2 != p0)
    while (p2 >= L1) {
      arr[p0--] = arr[p2--];
    }
}